

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_bool32
drwav_init_write__internal(drwav *pWav,drwav_data_format *pFormat,drwav_uint64 totalSampleCount)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  drwav *pWav_00;
  long in_RDX;
  int *in_RSI;
  long in_RDI;
  drwav_uint64 chunkSizeDATA_1;
  drwav_uint32 chunkSizeDATA;
  drwav_uint64 initialRiffChunkSize;
  drwav_uint32 initialds64ChunkSize;
  drwav_uint64 chunkSizeRIFF_1;
  drwav_uint32 chunkSizeRIFF;
  drwav_uint64 chunkSizeFMT;
  drwav_uint64 initialDataChunkSize;
  size_t runningPos;
  drwav *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  ulong local_30;
  long local_28;
  drwav_bool32 local_4;
  
  local_28 = 0;
  local_30 = 0;
  if (((*(int *)(in_RDI + 0xa0) == 0) ||
      (local_30 = in_RDX * (ulong)*(ushort *)(in_RDI + 0x52) >> 3, *in_RSI != 0)) ||
     (local_30 < 0xffffffdc)) {
    *(ulong *)(in_RDI + 0x98) = local_30;
    if (*in_RSI == 0) {
      sVar1 = drwav__write((drwav *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff98,0x161722);
      sVar2 = drwav__write_u32ne_to_le(in_stack_ffffffffffffff98,0);
      sVar3 = drwav__write((drwav *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff98,0x16175a);
      local_28 = sVar3 + sVar2 + sVar1;
    }
    else if (*in_RSI == 1) {
      sVar1 = drwav__write((drwav *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff98,0x161797);
      sVar2 = drwav__write_u64ne_to_le(in_stack_ffffffffffffff98,0x1617b0);
      sVar3 = drwav__write((drwav *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff98,0x1617d0);
      local_28 = sVar3 + sVar2 + sVar1;
    }
    else if (*in_RSI == 2) {
      sVar1 = drwav__write((drwav *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff98,0x1617fc);
      sVar2 = drwav__write_u32ne_to_le(in_stack_ffffffffffffff98,0);
      sVar3 = drwav__write((drwav *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff98,0x161835);
      local_28 = sVar3 + sVar2 + sVar1;
    }
    if (*in_RSI == 2) {
      sVar1 = drwav__write((drwav *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff98,0x161882);
      sVar2 = drwav__write_u32ne_to_le(in_stack_ffffffffffffff98,0);
      sVar3 = drwav__write_u64ne_to_le(in_stack_ffffffffffffff98,0x1618b3);
      sVar4 = drwav__write_u64ne_to_le(in_stack_ffffffffffffff98,0x1618cc);
      sVar5 = drwav__write_u64ne_to_le(in_stack_ffffffffffffff98,0x1618e5);
      sVar6 = drwav__write_u32ne_to_le(in_stack_ffffffffffffff98,0);
      local_28 = sVar6 + sVar5 + sVar4 + sVar3 + sVar2 + sVar1 + local_28;
    }
    if ((*in_RSI == 0) || (*in_RSI == 2)) {
      sVar1 = drwav__write((drwav *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff98,0x161938);
      sVar2 = drwav__write_u32ne_to_le(in_stack_ffffffffffffff98,0);
      local_28 = sVar2 + sVar1 + local_28;
    }
    else if (*in_RSI == 1) {
      sVar1 = drwav__write((drwav *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff98,0x161988);
      sVar2 = drwav__write_u64ne_to_le(in_stack_ffffffffffffff98,0x1619a1);
      local_28 = sVar2 + sVar1 + local_28;
    }
    sVar1 = drwav__write_u16ne_to_le(in_stack_ffffffffffffff98,0);
    sVar2 = drwav__write_u16ne_to_le(in_stack_ffffffffffffff98,0);
    sVar3 = drwav__write_u32ne_to_le(in_stack_ffffffffffffff98,0);
    sVar4 = drwav__write_u32ne_to_le(in_stack_ffffffffffffff98,0);
    sVar5 = drwav__write_u16ne_to_le(in_stack_ffffffffffffff98,0);
    sVar6 = drwav__write_u16ne_to_le(in_stack_ffffffffffffff98,0);
    *(size_t *)(in_RDI + 0x88) = sVar6 + sVar5 + sVar4 + sVar3 + sVar2 + sVar1 + local_28;
    if (*in_RSI == 0) {
      drwav__write((drwav *)CONCAT44((int)local_30,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff98,0x161a93);
      drwav__write_u32ne_to_le(in_stack_ffffffffffffff98,0);
    }
    else if (*in_RSI == 1) {
      pWav_00 = (drwav *)(local_30 + 0x18);
      drwav__write((drwav *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),pWav_00,
                   0x161ae7);
      drwav__write_u64ne_to_le(pWav_00,0x161aff);
    }
    else if (*in_RSI == 2) {
      drwav__write((drwav *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff98,0x161b2b);
      drwav__write_u32ne_to_le(in_stack_ffffffffffffff98,0);
    }
    *(int *)(in_RDI + 0x40) = *in_RSI;
    *(short *)(in_RDI + 0x70) = (short)in_RSI[2];
    *(int *)(in_RDI + 0x6c) = in_RSI[3];
    *(short *)(in_RDI + 0x72) = (short)in_RSI[4];
    *(short *)(in_RDI + 0x74) = (short)in_RSI[1];
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static drwav_bool32 drwav_init_write__internal(drwav* pWav, const drwav_data_format* pFormat, drwav_uint64 totalSampleCount)
{
    /* The function assumes drwav_preinit_write() was called beforehand. */

    size_t runningPos = 0;
    drwav_uint64 initialDataChunkSize = 0;
    drwav_uint64 chunkSizeFMT;

    /*
    The initial values for the "RIFF" and "data" chunks depends on whether or not we are initializing in sequential mode or not. In
    sequential mode we set this to its final values straight away since they can be calculated from the total sample count. In non-
    sequential mode we initialize it all to zero and fill it out in drwav_uninit() using a backwards seek.
    */
    if (pWav->isSequentialWrite) {
        initialDataChunkSize = (totalSampleCount * pWav->fmt.bitsPerSample) / 8;

        /*
        The RIFF container has a limit on the number of samples. drwav is not allowing this. There's no practical limits for Wave64
        so for the sake of simplicity I'm not doing any validation for that.
        */
        if (pFormat->container == drwav_container_riff) {
            if (initialDataChunkSize > (0xFFFFFFFFUL - 36)) {
                return DRWAV_FALSE; /* Not enough room to store every sample. */
            }
        }
    }

    pWav->dataChunkDataSizeTargetWrite = initialDataChunkSize;


    /* "RIFF" chunk. */
    if (pFormat->container == drwav_container_riff) {
        drwav_uint32 chunkSizeRIFF = 28 + (drwav_uint32)initialDataChunkSize;   /* +28 = "WAVE" + [sizeof "fmt " chunk] */
        runningPos += drwav__write(pWav, "RIFF", 4);
        runningPos += drwav__write_u32ne_to_le(pWav, chunkSizeRIFF);
        runningPos += drwav__write(pWav, "WAVE", 4);
    } else if (pFormat->container == drwav_container_w64) {
        drwav_uint64 chunkSizeRIFF = 80 + 24 + initialDataChunkSize;            /* +24 because W64 includes the size of the GUID and size fields. */
        runningPos += drwav__write(pWav, drwavGUID_W64_RIFF, 16);
        runningPos += drwav__write_u64ne_to_le(pWav, chunkSizeRIFF);
        runningPos += drwav__write(pWav, drwavGUID_W64_WAVE, 16);
    } else if (pFormat->container == drwav_container_rf64) {
        runningPos += drwav__write(pWav, "RF64", 4);
        runningPos += drwav__write_u32ne_to_le(pWav, 0xFFFFFFFF);               /* Always 0xFFFFFFFF for RF64. Set to a proper value in the "ds64" chunk. */
        runningPos += drwav__write(pWav, "WAVE", 4);
    }

    
    /* "ds64" chunk (RF64 only). */
    if (pFormat->container == drwav_container_rf64) {
        drwav_uint32 initialds64ChunkSize = 28;                                 /* 28 = [Size of RIFF (8 bytes)] + [Size of DATA (8 bytes)] + [Sample Count (8 bytes)] + [Table Length (4 bytes)]. Table length always set to 0. */
        drwav_uint64 initialRiffChunkSize = 8 + initialds64ChunkSize + initialDataChunkSize;    /* +8 for the ds64 header. */

        runningPos += drwav__write(pWav, "ds64", 4);
        runningPos += drwav__write_u32ne_to_le(pWav, initialds64ChunkSize);     /* Size of ds64. */
        runningPos += drwav__write_u64ne_to_le(pWav, initialRiffChunkSize);     /* Size of RIFF. Set to true value at the end. */
        runningPos += drwav__write_u64ne_to_le(pWav, initialDataChunkSize);     /* Size of DATA. Set to true value at the end. */
        runningPos += drwav__write_u64ne_to_le(pWav, totalSampleCount);         /* Sample count. */
        runningPos += drwav__write_u32ne_to_le(pWav, 0);                        /* Table length. Always set to zero in our case since we're not doing any other chunks than "DATA". */
    }


    /* "fmt " chunk. */
    if (pFormat->container == drwav_container_riff || pFormat->container == drwav_container_rf64) {
        chunkSizeFMT = 16;
        runningPos += drwav__write(pWav, "fmt ", 4);
        runningPos += drwav__write_u32ne_to_le(pWav, (drwav_uint32)chunkSizeFMT);
    } else if (pFormat->container == drwav_container_w64) {
        chunkSizeFMT = 40;
        runningPos += drwav__write(pWav, drwavGUID_W64_FMT, 16);
        runningPos += drwav__write_u64ne_to_le(pWav, chunkSizeFMT);
    }

    runningPos += drwav__write_u16ne_to_le(pWav, pWav->fmt.formatTag);
    runningPos += drwav__write_u16ne_to_le(pWav, pWav->fmt.channels);
    runningPos += drwav__write_u32ne_to_le(pWav, pWav->fmt.sampleRate);
    runningPos += drwav__write_u32ne_to_le(pWav, pWav->fmt.avgBytesPerSec);
    runningPos += drwav__write_u16ne_to_le(pWav, pWav->fmt.blockAlign);
    runningPos += drwav__write_u16ne_to_le(pWav, pWav->fmt.bitsPerSample);

    pWav->dataChunkDataPos = runningPos;

    /* "data" chunk. */
    if (pFormat->container == drwav_container_riff) {
        drwav_uint32 chunkSizeDATA = (drwav_uint32)initialDataChunkSize;
        runningPos += drwav__write(pWav, "data", 4);
        runningPos += drwav__write_u32ne_to_le(pWav, chunkSizeDATA);
    } else if (pFormat->container == drwav_container_w64) {
        drwav_uint64 chunkSizeDATA = 24 + initialDataChunkSize;     /* +24 because W64 includes the size of the GUID and size fields. */
        runningPos += drwav__write(pWav, drwavGUID_W64_DATA, 16);
        runningPos += drwav__write_u64ne_to_le(pWav, chunkSizeDATA);
    } else if (pFormat->container == drwav_container_rf64) {
        runningPos += drwav__write(pWav, "data", 4);
        runningPos += drwav__write_u32ne_to_le(pWav, 0xFFFFFFFF);   /* Always set to 0xFFFFFFFF for RF64. The true size of the data chunk is specified in the ds64 chunk. */
    }

    /*
    The runningPos variable is incremented in the section above but is left unused which is causing some static analysis tools to detect it
    as a dead store. I'm leaving this as-is for safety just in case I want to expand this function later to include other tags and want to
    keep track of the running position for whatever reason. The line below should silence the static analysis tools.
    */
    (void)runningPos;

    /* Set some properties for the client's convenience. */
    pWav->container = pFormat->container;
    pWav->channels = (drwav_uint16)pFormat->channels;
    pWav->sampleRate = pFormat->sampleRate;
    pWav->bitsPerSample = (drwav_uint16)pFormat->bitsPerSample;
    pWav->translatedFormatTag = (drwav_uint16)pFormat->format;

    return DRWAV_TRUE;
}